

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall
PrintfTest_SpaceFlag_Test::~PrintfTest_SpaceFlag_Test(PrintfTest_SpaceFlag_Test *this)

{
  void *in_RDI;
  
  ~PrintfTest_SpaceFlag_Test((PrintfTest_SpaceFlag_Test *)0x1407e8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(PrintfTest, SpaceFlag) {
  EXPECT_PRINTF(" 42", "% d", 42);
  EXPECT_PRINTF("-42", "% d", -42);
  EXPECT_PRINTF(" 0042", "% 05d", 42);
  EXPECT_PRINTF(" 0042", "%0  5d", 42);

  // ' ' flag is ignored for non-numeric types.
  EXPECT_PRINTF("x", "% c", 'x');
}